

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O2

bool_t priIsPrimeW(word a,void *stack)

{
  word wVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  word *pwVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  word b;
  bool bVar11;
  
  if ((3 < a & (byte)a) == 0) {
    uVar4 = (uint)((a & 0xfffffffffffffffe) == 2);
  }
  else {
    uVar8 = 0;
    wVar1 = a - 1;
    for (b = wVar1; (b & 1) == 0; b = b >> 1) {
      uVar8 = uVar8 + 1;
    }
    if (a < 0x11baa74c5) {
      pwVar6 = _bases32;
    }
    else {
      pwVar6 = _bases64;
    }
    if (a < 0x14f5d5) {
      pwVar6 = _bases16;
    }
    lVar7 = 2;
    if (a >= 0x14f5d5) {
      lVar7 = (ulong)(0x11baa74c4 < a) * 4 + 3;
    }
    do {
      do {
        bVar11 = lVar7 == 0;
        lVar7 = lVar7 + -1;
        if (bVar11) {
          return 1;
        }
        uVar5 = zzPowerModW(pwVar6[lVar7],b,a,stack);
      } while (uVar5 == wVar1 || uVar5 == 1);
      uVar9 = 1;
      while ((uVar10 = uVar8 + (uVar8 == 0), uVar9 < uVar8 &&
             (auVar2._8_8_ = 0, auVar2._0_8_ = uVar5, auVar3._8_8_ = 0, auVar3._0_8_ = uVar5,
             uVar5 = __umodti3(SUB168(auVar2 * auVar3,0),SUB168(auVar2 * auVar3,8),a,0),
             uVar10 = uVar9, wVar1 != uVar5))) {
        if (uVar5 == 1) goto LAB_0012ea2f;
        uVar9 = uVar9 + 1;
      }
    } while (uVar10 != uVar8);
LAB_0012ea2f:
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

bool_t priIsPrimeW(register word a, void* stack)
{
	const word* bases;
	register word r;
	register size_t s;
	register size_t iter;
	register size_t i;
	register word base;
	register dword prod;
	// маленькое или четное?
	if (a <= 3 || a % 2 == 0)
		return a == 2 || a == 3;
	// a - 1 = 2^s r (r -- нечетное)
	for (r = a - 1, s = 0; r % 2 == 0; r >>= 1, ++s);
	ASSERT(s > 0 && WORD_BIT_POS(s) * r + 1 == a);
	// выбираем базис
#if (B_PER_W == 16)
	bases = _bases16, iter = COUNT_OF(_bases16);
#elif (B_PER_W == 32)
	if (a < 1373653)
		bases = _bases16, iter = COUNT_OF(_bases16);
	else
		bases = _bases32, iter = COUNT_OF(_bases32);
#elif (B_PER_W == 64)
	if (a < 1373653)
		bases = _bases16, iter = COUNT_OF(_bases16);
	else if (a < 4759123141)
		bases = _bases32, iter = COUNT_OF(_bases32);
	else
		bases = _bases64, iter = COUNT_OF(_bases64);
#endif
	// итерации
	while (iter--)
	{
		// _bases[iter]^r \equiv \pm 1 \mod a?
		base = zzPowerModW(bases[iter], r, a, stack);
		if (base == 1 || base == a - 1)
			continue;
		// base^{2^i} \equiv - 1\mod a?
		for (i = 1; i < s; ++i)
		{
			prod = base;
			prod *= base, base = prod % a;
			if (base == a - 1)
				break;
			if (base == 1)
			{
				r = base = 0, s = iter = i = 0, prod = 0;
				return FALSE;
			}
		}
		if (i == s)
		{
			r = base = 0, s = iter = i = 0, prod = 0;
			return FALSE;
		}
	}
	r = base = 0, s = iter = i = 0, prod = 0;
	return TRUE;
}